

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.hpp
# Opt level: O3

back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_>
pstore::details::decode4<std::back_insert_iterator<pstore::small_vector<unsigned_char,128ul>>>
          (array<unsigned_char,_4UL> *in,
          back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_> out,uint count)

{
  byte *__value;
  ulong uVar1;
  array<unsigned_char,_3UL> result;
  byte local_23;
  byte local_22;
  char local_21;
  back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_> local_20;
  
  local_23 = in->_M_elems[1] >> 4 & 3 | in->_M_elems[0] << 2;
  local_22 = in->_M_elems[2] >> 2 & 0xf | in->_M_elems[1] << 4;
  local_21 = in->_M_elems[2] * '@' + in->_M_elems[3];
  if (count != 0) {
    uVar1 = (ulong)count;
    __value = &local_23;
    local_20.container = out.container;
    do {
      std::back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_>::operator=
                (&local_20,__value);
      __value = __value + 1;
      uVar1 = uVar1 - 1;
      out.container = local_20.container;
    } while (uVar1 != 0);
  }
  return (back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_>)out.container;
}

Assistant:

OutputIterator decode4 (std::array<std::uint8_t, 4> const & in, OutputIterator out,
                                unsigned const count) {
            std::array<std::uint8_t, 3> result;
            result[0] = static_cast<std::uint8_t> (static_cast<std::uint8_t> (in[0] << 2) +
                                                   ((in[1] & 0x30U) >> 4));
            result[1] = static_cast<std::uint8_t> (((in[1] & 0xFU) << 4) + ((in[2] & 0x3CU) >> 2));
            result[2] = static_cast<std::uint8_t> (((in[2] & 0x3U) << 6) + in[3]);
            for (auto ctr = 0U; ctr < count; ++ctr) {
                *out = result[ctr];
                ++out;
            }
            return out;
        }